

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<void*,unsigned_int&,void*,unsigned_int>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,void **args,uint *args_1,
          void **args_2,uint *args_3)

{
  string_view fmt_00;
  string_view_t msg;
  remove_cvref_t<fmt::v11::basic_appender<char>_> rVar1;
  char *s;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  time_point in_stack_00000020;
  undefined4 *in_stack_00000028;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffa80;
  logger *in_stack_fffffffffffffa88;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffa90;
  basic_appender<char> *in_stack_fffffffffffffab8;
  format_args in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffad0;
  buffer<char> *this_00;
  size_t in_stack_fffffffffffffad8;
  level_enum lvl_00;
  log_msg *this_01;
  size_t in_stack_fffffffffffffb00;
  string_view_t in_stack_fffffffffffffb08;
  source_loc in_stack_fffffffffffffb20;
  basic_string_view<char> local_468 [2];
  char *local_448;
  size_t sStack_440;
  log_msg *local_438;
  buffer<char> *local_3d0;
  undefined8 local_3c8 [2];
  undefined4 local_3b8 [4];
  undefined8 local_3a8 [2];
  undefined4 local_398 [6];
  undefined8 local_380;
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 local_368;
  basic_appender<char> local_360 [4];
  buffer<char> local_340 [9];
  undefined1 local_21a;
  byte local_219;
  undefined4 *local_218;
  undefined8 *local_210;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 *local_1e8;
  duration local_1e0;
  undefined4 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 local_4c;
  undefined4 *local_48;
  
  this_01 = (log_msg *)&stack0x00000008;
  local_218 = in_R9;
  local_210 = in_R8;
  local_1f8 = in_RDX;
  local_1f0 = in_RCX;
  local_219 = should_log(in_stack_fffffffffffffa88,
                         (level_enum)((ulong)in_stack_fffffffffffffa80 >> 0x20));
  local_21a = details::backtracer::enabled((backtracer *)0x280889);
  if (((local_219 & 1) != 0) || ((bool)local_21a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffa80,(allocator<char> *)in_stack_fffffffffffffa78);
    ::fmt::v11::basic_appender<char>::basic_appender(local_360,local_340);
    local_370 = local_1f8;
    local_368 = local_1f0;
    local_1d0 = local_210;
    local_1d8 = local_218;
    local_1e0 = in_stack_00000020.__d.__r;
    local_1e8 = in_stack_00000028;
    local_70 = *local_210;
    local_68 = local_3c8;
    local_48 = local_3b8;
    local_4c = *local_218;
    local_78 = local_3a8;
    local_80 = *(undefined8 *)in_stack_00000020.__d.__r;
    local_58 = local_398;
    local_5c = *in_stack_00000028;
    local_1c0 = &local_380;
    local_1c8 = local_3c8;
    local_380 = 0x2e2e;
    fmt_00.size_ = in_stack_fffffffffffffad8;
    fmt_00.data_ = in_stack_fffffffffffffad0;
    local_3c8[0] = local_70;
    local_3b8[0] = local_4c;
    local_3a8[0] = local_80;
    local_398[0] = local_5c;
    local_378 = local_1c8;
    rVar1 = ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                      (in_stack_fffffffffffffab8,fmt_00,in_stack_fffffffffffffac0);
    local_438 = *(log_msg **)&this_01->level;
    local_448 = (this_01->logger_name).data_;
    sStack_440 = (this_01->logger_name).size_;
    local_3d0 = rVar1.container;
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    lvl_00 = (level_enum)((ulong)rVar1.container >> 0x20);
    this_00 = local_340;
    s = ::fmt::v11::detail::buffer<char>::data(this_00);
    sVar2 = ::fmt::v11::detail::buffer<char>::size(this_00);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_468,s,sVar2);
    msg.size_ = in_stack_fffffffffffffb00;
    msg.data_ = in_RDI;
    sVar2 = sStack_440;
    log_msg_00 = local_438;
    details::log_msg::log_msg
              (this_01,in_stack_fffffffffffffb20,in_stack_fffffffffffffb08,lvl_00,msg);
    log_it_(in_stack_fffffffffffffa90,log_msg_00,SUB81(sVar2 >> 0x38,0),SUB81(sVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x280b8e);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }